

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer.cpp
# Opt level: O3

string * __thiscall
big_integer::to_string_abi_cxx11_(string *__return_storage_ptr__,big_integer *this)

{
  char cVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pcVar4;
  undefined1 auVar5 [16];
  char *pcVar6;
  pointer pcVar7;
  ulong uVar8;
  uint __val;
  ulong uVar9;
  long lVar10;
  big_integer BI;
  long *local_70;
  uint local_68;
  long local_60 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  int8_t local_38;
  
  puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar2 == puVar3) || (((long)puVar3 - (long)puVar2 == 4 && (*puVar2 == 0)))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,&this->digits);
    local_38 = this->sign;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    while (((long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != 4 ||
           (*local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start != 0))) {
      lVar10 = 0;
      __val = 0;
      for (puVar2 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish;
          puVar2 != local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start; puVar2 = puVar2 + -1) {
        uVar9 = lVar10 << 0x20 | (ulong)puVar2[-1];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar9;
        uVar8 = SUB168(auVar5 * ZEXT816(0x6666666666666667),8) >> 2;
        puVar2[-1] = (uint)uVar8;
        lVar10 = uVar9 + uVar8 * -10;
        __val = (uint)lVar10;
      }
      uVar8 = (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      if (1 < uVar8 &&
          local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] == 0) {
        do {
          uVar8 = uVar8 - 1;
          puVar2 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -2;
          local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          if (*puVar2 != 0) break;
        } while (1 < uVar8);
      }
      local_70 = local_60;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,local_68,__val);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pcVar7 = pcVar4 + (__return_storage_ptr__->_M_string_length - 1);
    if (pcVar4 < pcVar7 && __return_storage_ptr__->_M_string_length != 0) {
      do {
        pcVar6 = pcVar4 + 1;
        cVar1 = *pcVar4;
        *pcVar4 = *pcVar7;
        *pcVar7 = cVar1;
        pcVar7 = pcVar7 + -1;
        pcVar4 = pcVar6;
      } while (pcVar6 < pcVar7);
    }
    if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string big_integer::to_string() const {
    if (digits.empty() || (digits.size() == 1 && digits[0] == 0)) {
        return "0";
    } else {
        big_integer BI(*this);
        std::string outStr;

        while (!(BI.digits.size() == 1 && BI.digits[0] == 0)) {
            outStr += std::to_string(BI.div_long_short(10));
        }
        outStr += (BI.sign == 1 ? "" : "-");
        std::reverse(outStr.begin(), outStr.end());
        return outStr;
    }
}